

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O3

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::Allocate
          (CompressedTriangleFans *this,long numVertices,long numTriangles)

{
  unsigned_long size;
  
  if (0 < numVertices) {
    Vector<long>::Allocate(&this->m_numTFANs,numVertices);
    size = numVertices * 2;
    Vector<long>::Allocate(&this->m_degrees,size);
    Vector<long>::Allocate(&this->m_configs,size);
    Vector<long>::Allocate(&this->m_operations,size);
    Vector<long>::Allocate(&this->m_indices,size);
    Vector<long>::Allocate(&this->m_trianglesOrder,numTriangles);
    (this->m_numTFANs).m_size = 0;
    (this->m_degrees).m_size = 0;
    (this->m_configs).m_size = 0;
    (this->m_operations).m_size = 0;
    (this->m_indices).m_size = 0;
    return O3DGC_OK;
  }
  __assert_fail("numVertices > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0x3a,"O3DGCErrorCode o3dgc::CompressedTriangleFans::Allocate(long, long)");
}

Assistant:

O3DGCErrorCode              Allocate(long numVertices, long numTriangles)
                                    {
                                        assert(numVertices > 0);
                                        m_numTFANs.Allocate(numVertices);
                                        m_degrees.Allocate(2*numVertices);
                                        m_configs.Allocate(2*numVertices);
                                        m_operations.Allocate(2*numVertices);
                                        m_indices.Allocate(2*numVertices);
                                        m_trianglesOrder.Allocate(numTriangles);
                                        Clear();
                                        return O3DGC_OK;
                                    }